

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_dymon_srv.cpp
# Opt level: O0

void m_print_thread(void)

{
  cJSON *local_10;
  cJSON *labels;
  
  do {
    MessageQueue<cJSON_*,_32U>::pop(&m_LabelQueue,&local_10);
    m_print_labels(local_10);
    cJSON_Delete(local_10);
  } while( true );
}

Assistant:

static void m_print_thread()
{
   cJSON * labels;

   while (true)
   {
      //get next print request out of the queue. wait until one become available
      m_LabelQueue.pop(labels);
      //print the labels
      m_print_labels(labels);
      //cleanup JSON
      cJSON_Delete(labels);
   }
}